

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.h
# Opt level: O1

bool __thiscall
FIX::Session::isCorrectCompID(Session *this,SenderCompID *senderCompID,TargetCompID *targetCompID)

{
  size_t sVar1;
  int iVar2;
  
  if (this->m_checkCompId != true) {
    return true;
  }
  sVar1 = (this->m_sessionID).m_senderCompID.super_StringField.super_FieldBase.m_string.
          _M_string_length;
  if ((sVar1 == (targetCompID->super_StringField).super_FieldBase.m_string._M_string_length) &&
     (((sVar1 == 0 ||
       (iVar2 = bcmp((this->m_sessionID).m_senderCompID.super_StringField.super_FieldBase.m_string.
                     _M_dataplus._M_p,
                     (targetCompID->super_StringField).super_FieldBase.m_string._M_dataplus._M_p,
                     sVar1), iVar2 == 0)) &&
      (sVar1 = (this->m_sessionID).m_targetCompID.super_StringField.super_FieldBase.m_string.
               _M_string_length,
      sVar1 == (senderCompID->super_StringField).super_FieldBase.m_string._M_string_length)))) {
    if (sVar1 == 0) {
      return true;
    }
    iVar2 = bcmp((this->m_sessionID).m_targetCompID.super_StringField.super_FieldBase.m_string.
                 _M_dataplus._M_p,
                 (senderCompID->super_StringField).super_FieldBase.m_string._M_dataplus._M_p,sVar1);
    return iVar2 == 0;
  }
  return false;
}

Assistant:

bool isCorrectCompID(const SenderCompID &senderCompID, const TargetCompID &targetCompID) {
    if (!m_checkCompId) {
      return true;
    }

    return m_sessionID.getSenderCompID().getValue() == targetCompID.getValue()
           && m_sessionID.getTargetCompID().getValue() == senderCompID.getValue();
  }